

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_scan_header(j_compress_ptr cinfo)

{
  long in_RDI;
  j_compress_ptr unaff_retaddr;
  jpeg_component_info *compptr;
  int i;
  my_marker_ptr marker;
  boolean in_stack_ffffffffffffffe8;
  int index;
  j_compress_ptr cinfo_00;
  
  cinfo_00 = *(j_compress_ptr *)(in_RDI + 0x1d0);
  if (*(int *)(in_RDI + 0x104) == 0) {
    for (index = 0; index < *(int *)(in_RDI + 0x144); index = index + 1) {
      if ((*(int *)(in_RDI + 0x19c) == 0) && (*(int *)(in_RDI + 0x1a4) == 0)) {
        emit_dht(cinfo_00,index,in_stack_ffffffffffffffe8);
      }
      if (*(int *)(in_RDI + 0x1a0) != 0) {
        emit_dht(cinfo_00,index,in_stack_ffffffffffffffe8);
      }
    }
  }
  else {
    emit_dac(unaff_retaddr);
  }
  if (*(int *)(in_RDI + 0x118) != cinfo_00->input_components) {
    emit_dri((j_compress_ptr)0x12a29f);
    cinfo_00->input_components = *(int *)(in_RDI + 0x118);
  }
  emit_sos(cinfo_00);
  return;
}

Assistant:

METHODDEF(void)
write_scan_header(j_compress_ptr cinfo)
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;
  int i;
  jpeg_component_info *compptr;

  if (cinfo->arith_code) {
    /* Emit arith conditioning info.  We may have some duplication
     * if the file has multiple scans, but it's so small it's hardly
     * worth worrying about.
     */
    emit_dac(cinfo);
  } else {
    /* Emit Huffman tables.
     * Note that emit_dht() suppresses any duplicate tables.
     */
    for (i = 0; i < cinfo->comps_in_scan; i++) {
      compptr = cinfo->cur_comp_info[i];
      /* DC needs no table for refinement scan */
      if (cinfo->Ss == 0 && cinfo->Ah == 0)
        emit_dht(cinfo, compptr->dc_tbl_no, FALSE);
      /* AC needs no table when not present */
      if (cinfo->Se)
        emit_dht(cinfo, compptr->ac_tbl_no, TRUE);
    }
  }

  /* Emit DRI if required --- note that DRI value could change for each scan.
   * We avoid wasting space with unnecessary DRIs, however.
   */
  if (cinfo->restart_interval != marker->last_restart_interval) {
    emit_dri(cinfo);
    marker->last_restart_interval = cinfo->restart_interval;
  }

  emit_sos(cinfo);
}